

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O1

void __thiscall QGraphicsLinearLayout::invalidate(QGraphicsLinearLayout *this)

{
  QGraphicsLayoutItemPrivate *pQVar1;
  long *plVar2;
  
  pQVar1 = (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d;
  QGridLayoutEngine::invalidate();
  plVar2 = (long *)pQVar1[1].cachedSizeHints[0].ht;
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x30))();
  }
  QGraphicsLayout::invalidate(&this->super_QGraphicsLayout);
  return;
}

Assistant:

void QGraphicsLinearLayout::invalidate()
{
    Q_D(QGraphicsLinearLayout);
    d->engine.invalidate();
    if (d->m_styleInfo)
        d->m_styleInfo->invalidate();
    QGraphicsLayout::invalidate();
}